

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

void mnist_model_save(mnist_model *model,string *fname)

{
  initializer_list<ggml_tensor_*> __l;
  initializer_list<ggml_tensor_*> __l_00;
  bool bVar1;
  undefined8 uVar2;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *pvVar3;
  reference ppgVar4;
  long lVar5;
  undefined8 uVar6;
  long in_RDI;
  ggml_tensor *copy;
  ggml_tensor *t;
  iterator __end1;
  iterator __begin1;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__range1;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> weights;
  gguf_context *gguf_ctx;
  ggml_init_params params;
  ggml_context *ggml_ctx;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_fffffffffffffea0;
  iterator in_stack_fffffffffffffea8;
  ggml_tensor *pgVar11;
  size_type in_stack_fffffffffffffeb0;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined1 local_78 [24];
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 local_18;
  long local_8;
  
  local_8 = in_RDI;
  uVar2 = std::__cxx11::string::c_str();
  printf("%s: saving model to \'%s\'\n","mnist_model_save",uVar2);
  local_28 = 0;
  local_38 = 0x6400000;
  uStack_30 = 0;
  local_48 = 0;
  local_58 = 0x6400000;
  uStack_50 = 0;
  local_58._0_4_ = 0x6400000;
  local_58._4_4_ = 0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = 0;
  uVar7 = (undefined4)local_58;
  uVar8 = local_58._4_4_;
  uVar9 = (undefined4)uStack_50;
  uVar10 = uStack_50._4_4_;
  local_18 = ggml_init();
  pvVar3 = (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)gguf_init_empty();
  local_60 = pvVar3;
  uVar2 = std::__cxx11::string::c_str();
  gguf_set_val_str(pvVar3,"general.architecture",uVar2);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x10a539);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(uVar10,uVar9),(char *)CONCAT44(uVar8,uVar7));
  if (bVar1) {
    local_b8 = *(undefined8 *)(local_8 + 0x58);
    local_b0 = *(undefined8 *)(local_8 + 0x60);
    local_a8 = *(undefined8 *)(local_8 + 0x68);
    local_a0 = *(undefined8 *)(local_8 + 0x70);
    local_98 = &local_b8;
    local_90 = 4;
    __l._M_len = in_stack_fffffffffffffeb0;
    __l._M_array = in_stack_fffffffffffffea8;
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator=
              (in_stack_fffffffffffffea0,__l);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uVar10,uVar9),(char *)CONCAT44(uVar8,uVar7));
    if (bVar1) {
      local_f8 = *(undefined8 *)(local_8 + 0x78);
      local_f0 = *(undefined8 *)(local_8 + 0x80);
      local_e8 = *(undefined8 *)(local_8 + 0x88);
      local_e0 = *(undefined8 *)(local_8 + 0x90);
      local_d8 = *(undefined8 *)(local_8 + 0x98);
      local_d0 = *(undefined8 *)(local_8 + 0xa0);
      local_c8 = &local_f8;
      local_c0 = 6;
      __l_00._M_len = in_stack_fffffffffffffeb0;
      __l_00._M_array = in_stack_fffffffffffffea8;
      std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator=
                (in_stack_fffffffffffffea0,__l_00);
    }
    else {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x1b3,"GGML_ASSERT(%s) failed","false");
    }
  }
  local_100 = local_78;
  local_108._M_current =
       (ggml_tensor **)
       std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::begin
                 ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)CONCAT44(uVar8,uVar7));
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::end
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)CONCAT44(uVar8,uVar7));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                             *)CONCAT44(uVar10,uVar9),
                            (__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                             *)CONCAT44(uVar8,uVar7)), bVar1) {
    ppgVar4 = __gnu_cxx::
              __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
              ::operator*(&local_108);
    pgVar11 = *ppgVar4;
    lVar5 = ggml_dup_tensor(local_18,pgVar11);
    ggml_set_name(lVar5,pgVar11->name);
    uVar2 = *(undefined8 *)(lVar5 + 0xf8);
    uVar6 = ggml_nbytes();
    ggml_backend_tensor_get(pgVar11,uVar2,0,uVar6);
    gguf_add_tensor(local_60,lVar5);
    __gnu_cxx::
    __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>::
    operator++(&local_108);
  }
  pvVar3 = local_60;
  uVar2 = std::__cxx11::string::c_str();
  gguf_write_to_file(pvVar3,uVar2,0);
  ggml_free(local_18);
  gguf_free(local_60);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::~vector(pvVar3);
  return;
}

Assistant:

void mnist_model_save(mnist_model & model, const std::string & fname) {
    printf("%s: saving model to '%s'\n", __func__, fname.c_str());

    struct ggml_context * ggml_ctx;
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ 100 * 1024*1024,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ false,
        };
        ggml_ctx = ggml_init(params);
    }

    gguf_context * gguf_ctx = gguf_init_empty();
    gguf_set_val_str(gguf_ctx, "general.architecture", model.arch.c_str());

    std::vector<struct ggml_tensor *> weights;
    if (model.arch == "mnist-fc") {
        weights = {model.fc1_weight, model.fc1_bias, model.fc2_weight, model.fc2_bias};
    } else if (model.arch == "mnist-cnn") {
        weights = {model.conv1_kernel, model.conv1_bias, model.conv2_kernel, model.conv2_bias, model.dense_weight, model.dense_bias};
    } else {
        GGML_ASSERT(false);
    }
    for (struct ggml_tensor * t : weights) {
        struct ggml_tensor * copy = ggml_dup_tensor(ggml_ctx, t);
        ggml_set_name(copy, t->name);
        ggml_backend_tensor_get(t, copy->data, 0, ggml_nbytes(t));
        gguf_add_tensor(gguf_ctx, copy);
    }
    gguf_write_to_file(gguf_ctx, fname.c_str(), false);

    ggml_free(ggml_ctx);
    gguf_free(gguf_ctx);
}